

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePointRest<true>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,codepoint_t lower,
          EncodedCharPtr *startingLocation,EncodedCharPtr endOfSource,codepoint_t *outChar,
          bool *outContainsMultiUnitChar)

{
  size_t multiUnits;
  code *pcVar1;
  bool bVar2;
  OLECHAR ch;
  codepoint_t cVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  codepoint_t upper;
  size_t restorePoint;
  EncodedCharPtr currentLocation;
  bool *outContainsMultiUnitChar_local;
  codepoint_t *outChar_local;
  EncodedCharPtr endOfSource_local;
  EncodedCharPtr *startingLocation_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_10;
  codepoint_t lower_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  currentLocation = outContainsMultiUnitChar;
  outContainsMultiUnitChar_local = (bool *)outChar;
  outChar_local = (codepoint_t *)endOfSource;
  endOfSource_local = (EncodedCharPtr)startingLocation;
  startingLocation_local._4_4_ = lower;
  pSStack_10 = this;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14d,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (currentLocation == (EncodedCharPtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14e,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((this->es6UnicodeMode & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14f,"(es6UnicodeMode)","es6UnicodeMode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(startingLocation_local._4_4_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x150,"(Js::NumberUtilities::IsSurrogateLowerPart(lower))",
                       "Js::NumberUtilities::IsSurrogateLowerPart(lower)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  restorePoint = *(size_t *)endOfSource_local;
  *(codepoint_t *)outContainsMultiUnitChar_local = startingLocation_local._4_4_;
  if (restorePoint < outChar_local) {
    multiUnits = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    ch = UTF8EncodingPolicyBase<false>::ReadFull<true>
                   (&this->super_UTF8EncodingPolicyBase<false>,(EncodedCharPtr *)&restorePoint,
                    (EncodedCharPtr)outChar_local);
    bVar2 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)ch);
    if (bVar2) {
      cVar3 = Js::NumberUtilities::SurrogatePairAsCodePoint
                        (startingLocation_local._4_4_,(uint)(ushort)ch);
      *(codepoint_t *)outContainsMultiUnitChar_local = cVar3;
      BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(ch);
      if (BVar4 != 0) {
        *currentLocation = '\x01';
      }
      *(size_t *)endOfSource_local = restorePoint;
    }
    else {
      UTF8EncodingPolicyBase<false>::RestoreMultiUnits
                (&this->super_UTF8EncodingPolicyBase<false>,multiUnits);
    }
  }
  return true;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadCodePointRest(codepoint_t lower, EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *outContainsMultiUnitChar)

{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);
    Assert(es6UnicodeMode);
    Assert(Js::NumberUtilities::IsSurrogateLowerPart(lower));

    EncodedCharPtr currentLocation = startingLocation;
    *outChar = lower;

    if (currentLocation < endOfSource)
    {
        size_t restorePoint = this->m_cMultiUnits;
        codepoint_t upper = this->template ReadFull<bScan>(currentLocation, endOfSource);

        if (Js::NumberUtilities::IsSurrogateUpperPart(upper))
        {
            *outChar = Js::NumberUtilities::SurrogatePairAsCodePoint(lower, upper);

            if (this->IsMultiUnitChar(static_cast<OLECHAR>(upper)))
            {
                *outContainsMultiUnitChar = true;
            }

            startingLocation = currentLocation;
        }
        else
        {
            this->RestoreMultiUnits(restorePoint);
        }
    }

    return true;
}